

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O1

void __thiscall YAML::Scanner::ScanQuotedScalar(Scanner *this)

{
  int iVar1;
  size_type sVar2;
  char ch;
  undefined1 uVar3;
  RegEx *ex;
  ScanScalarParams *params_00;
  ScanScalarParams params;
  RegEx end;
  string scalar;
  undefined1 local_130 [48];
  RegEx local_100;
  char *local_e0;
  _Elt_pointer local_d8;
  char local_d0 [16];
  RegEx local_c0;
  RegEx local_a0;
  undefined1 local_80 [24];
  string local_68 [8];
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [32];
  
  local_d8 = (_Elt_pointer)0x0;
  local_d0[0] = '\0';
  local_e0 = local_d0;
  ch = YAML::Stream::peek(&this->INPUT);
  local_130._0_8_ = (istream *)0x0;
  local_130[8] = 0;
  local_130._20_4_ = utf8;
  local_130[0x18] = 0;
  local_130._12_4_ = 0;
  local_130[0x10] = 0;
  local_130[0x11] = 0;
  local_130[0x12] = 0;
  local_130._28_5_ = 0;
  local_130._33_3_ = 0;
  local_130._36_5_ = 0;
  if (ch == '\'') {
    RegEx::RegEx(&local_a0,'\'');
    ex = Exp::EscSingleQuote();
    operator!(&local_c0,ex);
    operator&((RegEx *)(local_130 + 0x30),&local_a0,&local_c0);
  }
  else {
    RegEx::RegEx((RegEx *)(local_130 + 0x30),ch);
  }
  uVar3 = 0x5c;
  if (ch == '\'') {
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_c0.m_params);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_a0.m_params);
    uVar3 = 0x27;
  }
  local_130._0_8_ = local_130 + 0x30;
  params_00 = (ScanScalarParams *)CONCAT71((int7)((ulong)local_130._0_8_ >> 8),1);
  local_130[8] = 1;
  local_130._12_4_ = 0;
  local_130._20_4_ = utf16be;
  local_130[0x11] = 1;
  local_130[0x18] = 0;
  local_130._28_5_ = 0x200000000;
  local_130._33_3_ = 0;
  local_130[0x12] = uVar3;
  InsertPotentialSimpleKey(this);
  sVar2._0_4_ = (this->INPUT).m_mark.pos;
  sVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::get(&this->INPUT);
  ScanScalar_abi_cxx11_((string *)local_80,(YAML *)this,(Stream *)local_130,params_00);
  std::__cxx11::string::operator=((string *)&local_e0,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_);
  }
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = true;
  local_80._0_8_ = (pointer)0x1400000000;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48._0_8_ = (pointer)0x0;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_80._8_8_ = sVar2;
  local_80._16_4_ = iVar1;
  local_68 = (string  [8])&local_58;
  std::__cxx11::string::_M_assign(local_68);
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  if (local_68 != (string  [8])&local_58) {
    operator_delete((void *)local_68);
  }
  std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector
            ((vector<YAML::RegEx,_std::allocator<YAML::RegEx>_> *)(local_130 + 0x38));
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return;
}

Assistant:

void Scanner::ScanQuotedScalar() {
  std::string scalar;

  // peek at single or double quote (don't eat because we need to preserve (for
  // the time being) the input position)
  char quote = INPUT.peek();
  bool single = (quote == '\'');

  // setup the scanning parameters
  ScanScalarParams params;
  RegEx end = (single ? RegEx(quote) & !Exp::EscSingleQuote() : RegEx(quote));
  params.end = &end;
  params.eatEnd = true;
  params.escape = (single ? '\'' : '\\');
  params.indent = 0;
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = false;
  params.chomp = CLIP;
  params.onDocIndicator = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();

  // now eat that opening quote
  INPUT.get();

  // and scan
  scalar = ScanScalar(INPUT, params);
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  Token token(Token::NON_PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}